

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Client * __thiscall
capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
          (Client *__return_storage_ptr__,Pipeline *this)

{
  Pipeline local_50;
  Own<capnp::ClientHook> local_28;
  PipelineOp *local_18;
  Pipeline *this_local;
  
  local_18 = (PipelineOp *)this;
  this_local = (Pipeline *)__return_storage_ptr__;
  ::capnp::AnyPointer::Pipeline::getPointerField(&local_50,&this->_typeless,1);
  ::capnp::AnyPointer::Pipeline::asCap((Pipeline *)&local_28);
  TestCallOrder::Client::Client(__return_storage_ptr__,&local_28);
  kj::Own<capnp::ClientHook>::~Own(&local_28);
  ::capnp::AnyPointer::Pipeline::~Pipeline(&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnproto_test::capnp::test::TestCallOrder::Client TestTailCallee::TailResult::Pipeline::getC() {
  return  ::capnproto_test::capnp::test::TestCallOrder::Client(_typeless.getPointerField(1).asCap());
}